

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall
gnuplotio::GnuplotTmpfileCollection::~GnuplotTmpfileCollection(GnuplotTmpfileCollection *this)

{
  GnuplotTmpfileCollection *this_local;
  
  std::
  vector<std::shared_ptr<gnuplotio::GnuplotTmpfile>,_std::allocator<std::shared_ptr<gnuplotio::GnuplotTmpfile>_>_>
  ::~vector(&this->tmp_files);
  return;
}

Assistant:

std::string make_tmpfile() {
        const bool debug_messages = false;
        std::shared_ptr<GnuplotTmpfile> tmp_file(new GnuplotTmpfile(debug_messages));
        // The file will be removed once the pointer is removed from the
        // tmp_files container.
        tmp_files.push_back(tmp_file);
        return tmp_file->file.string();
    }